

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O2

TestStatus *
vkt::api::anon_unknown_1::createMaxConcurrentTest<vkt::api::(anonymous_namespace)::Instance>
          (TestStatus *__return_storage_ptr__,Context *context)

{
  PlatformInterface *pPVar1;
  VkAllocationCallbacks *pVVar2;
  DeviceInterface *pDVar3;
  VkDevice pVVar4;
  size_t sVar5;
  size_t sVar6;
  char *pcVar7;
  Unique<vk::VkInstance_s_*> *ptr;
  Parameters *pPVar8;
  Resources *extraout_RDX;
  Resources *extraout_RDX_00;
  size_type __n;
  long lVar9;
  vector<de::SharedPtr<vk::refdetails::Unique<vk::VkInstance_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::VkInstance_s_*>_>_>_>
  objects;
  RefBase<vk::VkInstance_s_*> local_208;
  Environment env;
  AllocationCallbackRecorder allocRecorder;
  
  pVVar2 = ::vk::getSystemAllocator();
  ::vk::AllocationCallbackRecorder::AllocationCallbackRecorder(&allocRecorder,pVVar2,0x400);
  pPVar1 = context->m_platformInterface;
  pDVar3 = Context::getDeviceInterface(context);
  pVVar4 = Context::getDevice(context);
  env.queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  pPVar8 = (Parameters *)context->m_progCollection;
  env.allocationCallbacks =
       &allocRecorder.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks;
  env.maxResourceConsumers = 1;
  env.vkp = pPVar1;
  env.vkd = pDVar3;
  env.device = pVVar4;
  env.programBinaries = (BinaryCollection *)pPVar8;
  sVar5 = getCurrentSystemMemoryUsage(&allocRecorder);
  Instance::create((Move<vk::VkInstance_s_*> *)&local_208,&env,extraout_RDX,pPVar8);
  objects.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::VkInstance_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::VkInstance_s_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_208.m_data.deleter.m_allocator
  ;
  objects.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::VkInstance_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::VkInstance_s_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)local_208.m_data.object;
  objects.
  super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::VkInstance_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::VkInstance_s_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_208.m_data.deleter.m_destroyInstance;
  local_208.m_data.object = (VkInstance_s *)0x0;
  local_208.m_data.deleter.m_destroyInstance = (DestroyInstanceFunc)0x0;
  local_208.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::VkInstance_s_*>::~RefBase(&local_208);
  sVar6 = getCurrentSystemMemoryUsage(&allocRecorder);
  ::vk::refdetails::RefBase<vk::VkInstance_s_*>::~RefBase((RefBase<vk::VkInstance_s_*> *)&objects);
  ::vk::AllocationCallbackRecorder::~AllocationCallbackRecorder(&allocRecorder);
  sVar5 = getSafeObjectCount(context,sVar6 - sVar5,0);
  __n = 0x20;
  if (sVar5 < 0x20) {
    __n = sVar5;
  }
  Environment::Environment(&env,context,(deUint32)__n);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::VkInstance_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::VkInstance_s_*>_>_>_>
  ::vector(&objects,__n,(allocator_type *)&allocRecorder);
  allocRecorder.super_ChainedAllocator.super_AllocationCallbacks._vptr_AllocationCallbacks =
       (_func_int **)context->m_testCtx->m_log;
  pVVar2 = &allocRecorder.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)pVVar2);
  std::operator<<((ostream *)pVVar2,"Creating ");
  std::ostream::_M_insert<unsigned_long>((ulong)pVVar2);
  std::operator<<((ostream *)pVVar2," ");
  pcVar7 = ::vk::getTypeName<vk::VkInstance_s*>();
  std::operator<<((ostream *)pVVar2,pcVar7);
  std::operator<<((ostream *)pVVar2," objects");
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&allocRecorder,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)pVVar2);
  for (lVar9 = 0; __n * 0x10 != lVar9; lVar9 = lVar9 + 0x10) {
    ptr = (Unique<vk::VkInstance_s_*> *)operator_new(0x18);
    Instance::create((Move<vk::VkInstance_s_*> *)&allocRecorder,&env,extraout_RDX_00,pPVar8);
    (ptr->super_RefBase<vk::VkInstance_s_*>).m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)
         allocRecorder.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks.pfnAllocation;
    (ptr->super_RefBase<vk::VkInstance_s_*>).m_data.object =
         (VkInstance_s *)
         allocRecorder.super_ChainedAllocator.super_AllocationCallbacks._vptr_AllocationCallbacks;
    (ptr->super_RefBase<vk::VkInstance_s_*>).m_data.deleter.m_destroyInstance =
         (DestroyInstanceFunc)
         allocRecorder.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks.pUserData;
    allocRecorder.super_ChainedAllocator.super_AllocationCallbacks._vptr_AllocationCallbacks =
         (_func_int **)0x0;
    allocRecorder.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks.pUserData =
         (void *)0x0;
    allocRecorder.super_ChainedAllocator.super_AllocationCallbacks.m_callbacks.pfnAllocation =
         (PFN_vkAllocationFunction)0x0;
    de::SharedPtr<vk::refdetails::Unique<vk::VkInstance_s_*>_>::SharedPtr
              ((SharedPtr<vk::refdetails::Unique<vk::VkInstance_s_*>_> *)&local_208,ptr);
    de::SharedPtr<vk::refdetails::Unique<vk::VkInstance_s_*>_>::operator=
              ((SharedPtr<vk::refdetails::Unique<vk::VkInstance_s_*>_> *)
               ((long)&(objects.
                        super__Vector_base<de::SharedPtr<vk::refdetails::Unique<vk::VkInstance_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::VkInstance_s_*>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->m_ptr + lVar9),
               (SharedPtr<vk::refdetails::Unique<vk::VkInstance_s_*>_> *)&local_208);
    de::SharedPtr<vk::refdetails::Unique<vk::VkInstance_s_*>_>::release
              ((SharedPtr<vk::refdetails::Unique<vk::VkInstance_s_*>_> *)&local_208);
    ::vk::refdetails::RefBase<vk::VkInstance_s_*>::~RefBase
              ((RefBase<vk::VkInstance_s_*> *)&allocRecorder);
  }
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::VkInstance_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::VkInstance_s_*>_>_>_>
  ::clear(&objects);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&allocRecorder,"Ok",(allocator<char> *)&local_208);
  tcu::TestStatus::pass(__return_storage_ptr__,(string *)&allocRecorder);
  std::__cxx11::string::~string((string *)&allocRecorder);
  std::
  vector<de::SharedPtr<vk::refdetails::Unique<vk::VkInstance_s_*>_>,_std::allocator<de::SharedPtr<vk::refdetails::Unique<vk::VkInstance_s_*>_>_>_>
  ::~vector(&objects);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus createMaxConcurrentTest (Context& context, typename Object::Parameters params)
{
	typedef Unique<typename Object::Type>	UniqueObject;
	typedef SharedPtr<UniqueObject>			ObjectPtr;

	const deUint32						numObjects			= Object::getMaxConcurrent(context, params);
	const Environment					env					(context, numObjects);
	const typename Object::Resources	res					(env, params);
	vector<ObjectPtr>					objects				(numObjects);
	const deUint32						watchdogInterval	= 1024;

	context.getTestContext().getLog()
		<< TestLog::Message << "Creating " << numObjects << " " << getTypeName<typename Object::Type>() << " objects" << TestLog::EndMessage;

	for (deUint32 ndx = 0; ndx < numObjects; ndx++)
	{
		objects[ndx] = ObjectPtr(new UniqueObject(Object::create(env, res, params)));

		if ((ndx > 0) && ((ndx % watchdogInterval) == 0))
			context.getTestContext().touchWatchdog();
	}

	objects.clear();

	return tcu::TestStatus::pass("Ok");
}